

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool write_output_file(char *output,string *output_file)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *in_RDI;
  string msg_1;
  string msg;
  ofstream f;
  ostream *o;
  string local_278 [36];
  undefined4 local_254;
  string local_250 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  ostream local_220 [512];
  ostream *local_20;
  char *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  std::ofstream::ofstream(local_220);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    std::ofstream::open(local_220,uVar3,0x10);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      perror(pcVar4);
      local_1 = 0;
      local_254 = 1;
      std::__cxx11::string::~string(local_250);
      goto LAB_001d3c5e;
    }
    local_20 = local_220;
  }
  else {
    local_20 = (ostream *)&std::cout;
  }
  std::operator<<(local_20,local_10);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::ofstream::close();
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      perror(pcVar4);
      local_1 = 0;
      local_254 = 1;
      std::__cxx11::string::~string(local_278);
      goto LAB_001d3c5e;
    }
  }
  else {
    std::ostream::flush();
  }
  local_1 = 1;
  local_254 = 1;
LAB_001d3c5e:
  std::ofstream::~ofstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool write_output_file(const char *output, const std::string &output_file)
{
    std::ostream *o;
    std::ofstream f;

    if (output_file.empty()) {
        o = &std::cout;
    } else {
        f.open(output_file.c_str());
        if (!f.good()) {
            std::string msg = "Writing to output file: " + output_file;
            perror(msg.c_str());
            return false;
        }
        o = &f;
    }

    (*o) << output;

    if (output_file.empty()) {
        std::cout.flush();
    } else {
        f.close();
        if (!f.good()) {
            std::string msg = "Writing to output file: " + output_file;
            perror(msg.c_str());
            return false;
        }
    }
    return true;
}